

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_node_addchild(lys_node *parent,lys_module *module,lys_node *child)

{
  undefined2 uVar1;
  LYS_NODE LVar2;
  lys_module *plVar3;
  LYS_NODE LVar4;
  LY_STMT stmt;
  int iVar5;
  void *pvVar6;
  char *pcVar7;
  lys_node *plVar8;
  char *pcVar9;
  lys_node **pplVar10;
  lys_node *plVar11;
  LY_VLOG_ELEM elem_type;
  lys_node *plVar12;
  LY_ECODE code;
  LYS_NODE LVar13;
  bool bVar14;
  lyext_substmt *local_38;
  lyext_substmt *info;
  
  local_38 = (lyext_substmt *)0x0;
  if (child == (lys_node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x2be,
                  "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                 );
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x2c4,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
    LVar13 = LYS_UNKNOWN;
    if ((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) {
      __assert_fail("!(child->nodetype & (LYS_INPUT | LYS_OUTPUT))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x2c5,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
  }
  else {
    LVar13 = parent->nodetype;
    module = parent->module;
  }
  bVar14 = true;
  if ((int)LVar13 < 0x100) {
    if ((int)LVar13 < 0x10) {
      switch(LVar13) {
      case LYS_UNKNOWN:
        if ((child->nodetype & 0xb9bf) != LYS_UNKNOWN) goto switchD_00155046_caseD_3;
        pcVar7 = strnodetype(child->nodetype);
        pcVar9 = "(sub)module";
        break;
      case LYS_CONTAINER:
switchD_00155046_caseD_1:
        LVar2 = child->nodetype;
        LVar4 = LVar2 & 0xd8bf;
        goto joined_r0x001551cb;
      case LYS_CHOICE:
        LVar2 = child->nodetype;
        if ((LVar2 & 0x807f) != LYS_UNKNOWN) {
          bVar14 = LVar2 == LYS_CASE;
          goto switchD_00155046_caseD_3;
        }
        pcVar7 = strnodetype(LVar2);
        pcVar9 = "choice";
        break;
      default:
        goto switchD_00155046_caseD_3;
      case LYS_LEAF:
      case LYS_LEAFLIST:
switchD_00155046_caseD_4:
        pcVar9 = strnodetype(child->nodetype);
        pcVar7 = strnodetype(parent->nodetype);
        ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar9,pcVar7);
        pcVar9 = strnodetype(parent->nodetype);
        pcVar7 = "The \"%s\" statement cannot have any data substatement.";
        code = LYE_SPEC;
        elem_type = LY_VLOG_PREV;
        parent = (lys_node *)0x0;
        goto LAB_00155425;
      }
    }
    else {
      if ((int)LVar13 < 0x40) {
        if (LVar13 != LYS_LIST) {
          if (LVar13 != LYS_ANYXML) goto switchD_00155046_caseD_3;
          goto switchD_00155046_caseD_4;
        }
        goto switchD_00155046_caseD_1;
      }
      if (LVar13 != LYS_CASE) {
        if (LVar13 != LYS_NOTIF) goto switchD_00155046_caseD_3;
        goto LAB_00155199;
      }
      if ((child->nodetype & 0x903f) != LYS_UNKNOWN) goto switchD_00155046_caseD_3;
      pcVar7 = strnodetype(child->nodetype);
      pcVar9 = "case";
    }
LAB_00155415:
    code = LYE_INCHILDSTMT;
    elem_type = LY_VLOG_LYS;
  }
  else {
    if ((int)LVar13 < 0x1000) {
      if ((int)LVar13 < 0x400) {
        if (LVar13 == LYS_RPC) goto LAB_00155203;
        if (LVar13 != LYS_INPUT) goto switchD_00155046_caseD_3;
      }
      else if (LVar13 != LYS_OUTPUT) {
        if (LVar13 != LYS_GROUPING) goto switchD_00155046_caseD_3;
        goto switchD_00155046_caseD_1;
      }
LAB_00155199:
      LVar2 = child->nodetype;
      LVar4 = LVar2 & 0x983f;
    }
    else {
      if (0x3fff < (int)LVar13) {
        if (LVar13 != LYS_ACTION) {
          if (LVar13 == LYS_ANYDATA) goto switchD_00155046_caseD_4;
          if (LVar13 != LYS_EXT) goto switchD_00155046_caseD_3;
          stmt = lys_snode2stmt(child->nodetype);
          pvVar6 = lys_ext_complex_get_substmt(stmt,(lys_ext_instance_complex *)parent,&local_38);
          if (pvVar6 != (void *)0x0) goto switchD_00155046_caseD_3;
          pcVar7 = strnodetype(child->nodetype);
          pcVar9 = *(char **)parent->name;
          goto LAB_00155415;
        }
LAB_00155203:
        if ((child->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN)
        goto switchD_00155046_caseD_3;
        pcVar7 = strnodetype(child->nodetype);
        pcVar9 = "rpc";
        goto LAB_00155415;
      }
      if (LVar13 == LYS_USES) goto switchD_00155046_caseD_1;
      if (LVar13 != LYS_AUGMENT) goto switchD_00155046_caseD_3;
      LVar2 = child->nodetype;
      LVar4 = LVar2 & 0xd0ff;
    }
joined_r0x001551cb:
    if (LVar4 != LYS_UNKNOWN) {
switchD_00155046_caseD_3:
      iVar5 = lys_check_id(child,parent,module);
      if (iVar5 != 0) {
        return 1;
      }
      if (child->parent != (lys_node *)0x0) {
        lys_node_unlink(child);
      }
      if (((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) ||
         (parent->nodetype == LYS_EXT)) {
        if (!bVar14) {
          plVar8 = (lys_node *)calloc(1,0x70);
          pcVar9 = lydict_insert(module->ctx,child->name,0);
          plVar8->name = pcVar9;
          plVar8->flags = 0x40;
          plVar8->module = module;
          plVar8->nodetype = LYS_CASE;
          plVar8->prev = plVar8;
          lys_node_addchild(parent,module,plVar8);
          parent = plVar8;
        }
        if (parent == (lys_node *)0x0) {
          plVar8 = module->data;
          if (plVar8 == (lys_node *)0x0) {
            module->data = child;
          }
          else {
            plVar11 = plVar8->prev;
            plVar11->next = child;
            child->prev = plVar11;
            plVar8->prev = child;
          }
          parent = (lys_node *)0x0;
        }
        else {
          pplVar10 = lys_child(parent,child->nodetype);
          if (pplVar10 == (lys_node **)0x0) {
            __assert_fail("pchild",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                          ,0x356,
                          "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                         );
          }
          plVar8 = *pplVar10;
          if (plVar8 == (lys_node *)0x0) {
            *pplVar10 = child;
            child->parent = parent;
            plVar11 = (lys_node *)0x0;
            plVar8 = child;
          }
          else if (LVar13 == LYS_AUGMENT) {
            do {
              plVar8 = plVar8->prev;
            } while (plVar8->parent != parent);
            plVar11 = plVar8->next;
            plVar8->next = child;
            child->prev = plVar8;
          }
          else {
            plVar8 = plVar8->prev;
            plVar8->next = child;
            child->prev = plVar8;
            plVar11 = (lys_node *)0x0;
          }
          for (plVar12 = plVar8->next; plVar12 != (lys_node *)0x0; plVar12 = plVar12->next) {
            plVar12->parent = parent;
            plVar8 = plVar12;
          }
          if (plVar11 == (lys_node *)0x0) {
            (*pplVar10)->prev = plVar8;
          }
          else {
            plVar8->next = plVar11;
            plVar11->prev = plVar8;
          }
        }
      }
      else {
        plVar8 = parent->child;
        if (child->nodetype == LYS_OUTPUT) {
          plVar8 = plVar8->next;
        }
        else {
          parent->child = child;
        }
        plVar11 = plVar8->next;
        if (plVar11 == (lys_node *)0x0) {
          parent->child->prev = child;
        }
        else {
          child->next = plVar11;
          plVar11->prev = child;
          plVar8->next = (lys_node *)0x0;
        }
        plVar11 = plVar8->prev;
        child->prev = plVar11;
        if (plVar11->next != (lys_node *)0x0) {
          plVar11->next = child;
        }
        plVar8->prev = plVar8;
        child->parent = parent;
        plVar8->parent = (lys_node *)0x0;
        lys_node_free(plVar8,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
      }
      bVar14 = parent != (lys_node *)0x0;
      if (bVar14) {
        uVar1 = *(undefined2 *)((long)&parent->nodetype + 1);
        plVar8 = parent;
        while ((uVar1 & (LYS_EXT|LYS_AUGMENT|LYS_GROUPING) >> 8) == LYS_UNKNOWN >> 8) {
          plVar8 = plVar8->parent;
          bVar14 = plVar8 != (lys_node *)0x0;
          if (plVar8 == (lys_node *)0x0) break;
          uVar1 = *(undefined2 *)((long)&plVar8->nodetype + 1);
        }
      }
      if (!(bool)(parent == (lys_node *)0x0 | bVar14)) {
        plVar8 = child;
        if (child != (lys_node *)0x0) {
          do {
            if ((plVar8->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN)
            goto LAB_001554b3;
            pplVar10 = &plVar8->parent;
            plVar8 = *pplVar10;
          } while (*pplVar10 != (lys_node *)0x0);
        }
        if (((parent->flags & 2) != 0) && ((child->flags & 1) != 0)) {
          ly_vlog(LYE_INARG,LY_VLOG_LYS,child,"true","config");
          ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "State nodes cannot have configuration nodes as children.");
          return 1;
        }
      }
LAB_001554b3:
      LVar13 = child->nodetype;
      if (((LVar13 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
           LYS_UNKNOWN) && (parent != (lys_node *)0x0 && (child->flags & 0x80) != 0)) {
        do {
          if ((parent->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
            if ((char)parent->flags < '\0') break;
            parent->flags = parent->flags | 0x80;
          }
          if (parent->nodetype == LYS_EXT) {
            if (parent->padding[1] == '\x01') {
              parent = (lys_node *)parent->dsc;
              goto LAB_00155507;
            }
LAB_00155516:
            parent = (lys_node *)0x0;
          }
          else {
            parent = parent->parent;
            if (parent == (lys_node *)0x0) goto LAB_00155516;
LAB_00155507:
            if (parent->nodetype == LYS_AUGMENT) {
              parent = parent->prev;
            }
          }
        } while (parent != (lys_node *)0x0);
      }
      if ((LVar13 & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
        plVar8 = (lys_node *)calloc(1,0x78);
        plVar8->nodetype = LYS_INPUT;
        pcVar9 = lydict_insert(child->module->ctx,"input",5);
        plVar8->name = pcVar9;
        plVar11 = (lys_node *)calloc(1,0x78);
        pcVar9 = lydict_insert(child->module->ctx,"output",6);
        plVar11->name = pcVar9;
        plVar11->nodetype = LYS_OUTPUT;
        plVar3 = child->module;
        plVar11->module = plVar3;
        plVar8->module = plVar3;
        plVar11->parent = child;
        plVar8->parent = child;
        plVar11->flags = 0x40;
        plVar8->flags = 0x40;
        plVar8->next = plVar11;
        plVar8->prev = plVar11;
        plVar11->prev = plVar8;
        child->child = plVar8;
        return 0;
      }
      return 0;
    }
    pcVar7 = strnodetype(LVar2);
    pcVar9 = strnodetype(parent->nodetype);
    code = LYE_INCHILDSTMT;
    elem_type = LY_VLOG_LYS;
  }
LAB_00155425:
  ly_vlog(code,elem_type,parent,pcVar7,pcVar9);
  return 1;
}

Assistant:

int
lys_node_addchild(struct lys_node *parent, struct lys_module *module, struct lys_node *child)
{
    struct lys_node *iter, *next, **pchild;
    struct lys_node_inout *in, *out, *inout;
    struct lys_node_case *c;
    int type, shortcase = 0;
    void *p;
    struct lyext_substmt *info = NULL;

    assert(child);

    if (parent) {
        type = parent->nodetype;
        module = parent->module;
    } else {
        assert(module);
        assert(!(child->nodetype & (LYS_INPUT | LYS_OUTPUT)));
        type = 0;
    }

    /* checks */
    switch (type) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
    case LYS_USES:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_CHOICE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "choice");
            return EXIT_FAILURE;
        }
        if (child->nodetype != LYS_CASE) {
            shortcase = 1;
        }
        break;
    case LYS_CASE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "case");
            return EXIT_FAILURE;
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (!(child->nodetype & (LYS_INPUT | LYS_OUTPUT | LYS_GROUPING))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "rpc");
            return EXIT_FAILURE;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
        LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "The \"%s\" statement cannot have any data substatement.",
               strnodetype(parent->nodetype));
        return EXIT_FAILURE;
    case LYS_AUGMENT:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_UNKNOWN:
        /* top level */
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_GROUPING
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_RPC | LYS_NOTIF | LYS_AUGMENT))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "(sub)module");
            return EXIT_FAILURE;
        }
        break;
    case LYS_EXT:
        /* plugin-defined */
        p = lys_ext_complex_get_substmt(lys_snode2stmt(child->nodetype), (struct lys_ext_instance_complex*)parent, &info);
        if (!p) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype),
                   ((struct lys_ext_instance_complex*)parent)->def->name);
            return EXIT_FAILURE;
        }
        /* TODO check cardinality */
        break;
    }

    /* check identifier uniqueness */
    if (lys_check_id(child, parent, module)) {
        return EXIT_FAILURE;
    }

    if (child->parent) {
        lys_node_unlink(child);
    }

    if ((child->nodetype & (LYS_INPUT | LYS_OUTPUT)) && parent->nodetype != LYS_EXT) {
        /* replace the implicit input/output node */
        if (child->nodetype == LYS_OUTPUT) {
            inout = (struct lys_node_inout *)parent->child->next;
        } else { /* LYS_INPUT */
            inout = (struct lys_node_inout *)parent->child;
            parent->child = child;
        }
        if (inout->next) {
            child->next = inout->next;
            inout->next->prev = child;
            inout->next = NULL;
        } else {
            parent->child->prev = child;
        }
        child->prev = inout->prev;
        if (inout->prev->next) {
            inout->prev->next = child;
        }
        inout->prev = (struct lys_node *)inout;
        child->parent = parent;
        inout->parent = NULL;
        lys_node_free((struct lys_node *)inout, NULL, 0);
    } else {
        if (shortcase) {
            /* create the implicit case to allow it to serve as a target of the augments,
             * it won't be printed, but it will be present in the tree */
            c = calloc(1, sizeof *c);
            c->name = lydict_insert(module->ctx, child->name, 0);
            c->flags = LYS_IMPLICIT;
            c->module = module;
            c->nodetype = LYS_CASE;
            c->prev = (struct lys_node*)c;
            lys_node_addchild(parent, module, (struct lys_node*)c);
            parent = (struct lys_node*)c;
        }
        /* connect the child correctly */
        if (!parent) {
            if (module->data) {
                module->data->prev->next = child;
                child->prev = module->data->prev;
                module->data->prev = child;
            } else {
                module->data = child;
            }
        } else {
            next = NULL;
            pchild = lys_child(parent, child->nodetype);
            assert(pchild);

            if (!(*pchild)) {
                /* the only/first child of the parent */
                *pchild = child;
                child->parent = parent;
                iter = child;
            } else if (type == LYS_AUGMENT) {
                /* add a new child as a last child of the augment (no matter if applied or not) */
                for (iter = (*pchild)->prev; iter->parent != parent; iter = iter->prev);
                next = iter->next;
                iter->next = child;
                child->prev = iter;
            } else {
                /* add a new child at the end of parent's child list */
                iter = (*pchild)->prev;
                iter->next = child;
                child->prev = iter;
            }
            while (iter->next) {
                iter = iter->next;
                iter->parent = parent;
            }
            if (next) {
                /* we are in applied augment, its target has some additional nodes after the nodes from this augment */
                iter->next = next;
                next->prev = iter;
            } else {
                (*pchild)->prev = iter;
            }
        }
    }

    /* check config value (but ignore them in groupings and augments) */
    for (iter = parent; iter && !(iter->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); iter = iter->parent);
    if (parent && !iter) {
        for (iter = child; iter && !(iter->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); iter = iter->parent);
        if (!iter && (parent->flags & LYS_CONFIG_R) && (child->flags & LYS_CONFIG_W)) {
            LOGVAL(LYE_INARG, LY_VLOG_LYS, child, "true", "config");
            LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
            return EXIT_FAILURE;
        }
    }

    /* propagate information about status data presence */
    if ((child->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) &&
            (child->flags & LYS_INCL_STATUS)) {
        for(iter = parent; iter; iter = lys_parent(iter)) {
            /* store it only into container or list - the only data inner nodes */
            if (iter->nodetype & (LYS_CONTAINER | LYS_LIST)) {
                if (iter->flags & LYS_INCL_STATUS) {
                    /* done, someone else set it already from here */
                    break;
                }
                /* set flag about including status data */
                iter->flags |= LYS_INCL_STATUS;
            }
        }
    }

    /* create implicit input/output nodes to have available them as possible target for augment */
    if (child->nodetype & (LYS_RPC | LYS_ACTION)) {
        in = calloc(1, sizeof *in);
        in->nodetype = LYS_INPUT;
        in->name = lydict_insert(child->module->ctx, "input", 5);
        out = calloc(1, sizeof *out);
        out->name = lydict_insert(child->module->ctx, "output", 6);
        out->nodetype = LYS_OUTPUT;
        in->module = out->module = child->module;
        in->parent = out->parent = child;
        in->flags = out->flags = LYS_IMPLICIT;
        in->next = (struct lys_node *)out;
        in->prev = (struct lys_node *)out;
        out->prev = (struct lys_node *)in;
        child->child = (struct lys_node *)in;
    }
    return EXIT_SUCCESS;
}